

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O2

int __thiscall
icu_63::SimpleTimeZone::clone
          (SimpleTimeZone *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SimpleTimeZone *this_00;
  
  this_00 = (SimpleTimeZone *)UMemory::operator_new((UMemory *)0xa0,(size_t)__fn);
  if (this_00 != (SimpleTimeZone *)0x0) {
    SimpleTimeZone(this_00,this);
  }
  return (int)this_00;
}

Assistant:

TimeZone*
SimpleTimeZone::clone() const
{
    return new SimpleTimeZone(*this);
}